

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

void __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::uconv::uconv
          (uconv *this,string *charset,cpcvt_type cvt_type)

{
  UBool UVar1;
  undefined8 uVar2;
  long lVar3;
  int in_EDX;
  string *in_RSI;
  long *in_RDI;
  UErrorCode err;
  string local_38 [32];
  UErrorCode code;
  
  code = U_ZERO_ERROR;
  uVar2 = ::std::__cxx11::string::c_str();
  lVar3 = ucnv_open_70(uVar2,&stack0xffffffffffffffe8);
  *in_RDI = lVar3;
  if (*in_RDI != 0) {
    UVar1 = U_FAILURE(code);
    if (UVar1 == '\0') {
      if (in_EDX == 0) {
        ucnv_setFromUCallBack_70
                  (*in_RDI,UCNV_FROM_U_CALLBACK_SKIP_70,0,0,0,&stack0xffffffffffffffe8);
        check_and_throw_icu_error(U_ZERO_ERROR);
        ucnv_setToUCallBack_70(*in_RDI,UCNV_TO_U_CALLBACK_SKIP_70,0,0,0,&stack0xffffffffffffffe8);
        check_and_throw_icu_error(U_ZERO_ERROR);
      }
      else {
        ucnv_setFromUCallBack_70
                  (*in_RDI,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,&stack0xffffffffffffffe8);
        check_and_throw_icu_error(U_ZERO_ERROR);
        ucnv_setToUCallBack_70(*in_RDI,UCNV_TO_U_CALLBACK_STOP_70,0,0,0,&stack0xffffffffffffffe8);
        check_and_throw_icu_error(U_ZERO_ERROR);
      }
      return;
    }
  }
  if (*in_RDI != 0) {
    ucnv_close_70(*in_RDI);
  }
  uVar2 = __cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string(local_38,in_RSI);
  conv::invalid_charset_error::invalid_charset_error
            ((invalid_charset_error *)in_RSI,(string *)CONCAT44(in_EDX,code));
  __cxa_throw(uVar2,&conv::invalid_charset_error::typeinfo,
              conv::invalid_charset_error::~invalid_charset_error);
}

Assistant:

uconv(std::string const &charset,cpcvt_type cvt_type=cvt_skip) 
            {
                UErrorCode err=U_ZERO_ERROR;
                cvt_ = ucnv_open(charset.c_str(),&err);
                if(!cvt_ || U_FAILURE(err)) {
                    if(cvt_)
                        ucnv_close(cvt_);
                    throw conv::invalid_charset_error(charset);
                }
                
                try {
                    if(cvt_type==cvt_skip) {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                    else {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                }
                catch(...) { ucnv_close(cvt_) ; throw; }
            }